

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.h
# Opt level: O2

optional<NetAction> s_try_recv<NetAction>(socket_t *socket)

{
  ulong uVar1;
  ulong uVar2;
  NetAction val;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  response;
  uint local_34;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_30;
  char local_10;
  
  s_recv_raw_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_30._M_value,socket);
  if (local_10 == '\x01') {
    local_34 = 0;
    memcpy(&local_34,(void *)local_30._M_value._M_dataplus._M_p,local_30._M_value._M_string_length);
    uVar1 = (ulong)local_34;
    uVar2 = 0x100000000;
  }
  else {
    uVar2 = 0;
    uVar1 = 0;
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_30._M_value);
  return (_Optional_base<NetAction,_true,_true>)
         (_Optional_base<NetAction,_true,_true>)(uVar2 | uVar1);
}

Assistant:

std::optional<T> s_try_recv(zmq::socket_t *socket) {
    static_assert(is_transferable<T>::value, "Cannot transfer this type");
    auto response{s_recv_raw(socket)};
    if (!response.has_value()) {
        return std::nullopt;
    }

    T val{};
    assert(sizeof(T) == response->size());
    ::memcpy(&val, response->data(), response->size());
    return val;
}